

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPreviewImageAttribute.cpp
# Opt level: O1

void __thiscall
Imf_2_5::TypedAttribute<Imf_2_5::PreviewImage>::writeValueTo
          (TypedAttribute<Imf_2_5::PreviewImage> *this,OStream *os,int version)

{
  PreviewRgba *pPVar1;
  uint uVar2;
  ulong uVar3;
  uchar local_3c;
  uchar local_3b;
  uchar local_3a;
  uchar local_39;
  uint local_38;
  uint local_34;
  
  local_38 = (this->_value)._width;
  (*os->_vptr_OStream[2])(os,&local_38,4);
  local_34 = (this->_value)._height;
  (*os->_vptr_OStream[2])(os,&local_34,4);
  uVar2 = (this->_value)._height * (this->_value)._width;
  if (0 < (int)uVar2) {
    pPVar1 = (this->_value)._pixels;
    uVar3 = 0;
    do {
      local_3c = pPVar1[uVar3].r;
      (*os->_vptr_OStream[2])(os,&local_3c,1);
      local_3b = pPVar1[uVar3].g;
      (*os->_vptr_OStream[2])(os,&local_3b,1);
      local_3a = pPVar1[uVar3].b;
      (*os->_vptr_OStream[2])(os,&local_3a,1);
      local_39 = pPVar1[uVar3].a;
      (*os->_vptr_OStream[2])(os,&local_39,1);
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  return;
}

Assistant:

void
PreviewImageAttribute::writeValueTo (OPENEXR_IMF_INTERNAL_NAMESPACE::OStream &os, int version) const
{
    Xdr::write <StreamIO> (os, _value.width());
    Xdr::write <StreamIO> (os, _value.height());

    int numPixels = _value.width() * _value.height();
    const PreviewRgba *pixels = _value.pixels();

    for (int i = 0; i < numPixels; ++i)
    {
	Xdr::write <StreamIO> (os, pixels[i].r);
	Xdr::write <StreamIO> (os, pixels[i].g);
	Xdr::write <StreamIO> (os, pixels[i].b);
	Xdr::write <StreamIO> (os, pixels[i].a);
    }
}